

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::matrix3f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *result)

{
  bool bVar1;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  matrix3f value_1;
  char nc;
  char c;
  undefined1 local_4c [8];
  matrix3f value;
  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  value.m[2]._4_8_ = result;
  ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::clear
            (result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    tinyusdz::value::matrix3f::matrix3f((matrix3f *)local_4c);
    bVar1 = ReadBasicType(this,(matrix3f *)local_4c);
    if (bVar1) {
      ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
      push_back((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                value.m[2]._4_8_,(value_type *)local_4c);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,(char *)((long)value_1.m[2] + 6));
        if (!bVar1) {
          return false;
        }
        if (value_1.m[2][1]._2_1_ == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            return false;
          }
          bVar1 = LookChar1(this,(char *)((long)value_1.m[2] + 5));
          if (!bVar1) {
            return false;
          }
          if (value_1.m[2][1]._1_1_ == end_symbol) break;
        }
        if (value_1.m[2][1]._2_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        tinyusdz::value::matrix3f::matrix3f((matrix3f *)local_98);
        bVar1 = ReadBasicType(this,(matrix3f *)local_98);
        if (!bVar1) break;
        ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
        push_back((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                  value.m[2]._4_8_,(value_type *)local_98);
      }
      bVar1 = ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
              empty((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *
                    )value.m[2]._4_8_);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_b8,"Empty array.\n",&local_b9);
        PushError(this,&local_b8);
        ::std::__cxx11::string::~string((string *)&local_b8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(value_1.m[2] + 2),"Not starting with the value of requested type.\n",
                 (allocator *)((long)value_1.m[2] + 7));
      PushError(this,(string *)(value_1.m[2] + 2));
      ::std::__cxx11::string::~string((string *)(value_1.m[2] + 2));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)value_1.m[2] + 7));
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}